

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupBlock(Gia_Man_t *p,int nBlock)

{
  char *pcVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  int iVar6;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *pVVar10;
  Gia_Man_t *pGVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  
  if (p->vCis->nSize % nBlock != 0) {
    __assert_fail("Gia_ManCiNum(p) % nBlock == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x6bd,"Gia_Man_t *Gia_ManDupBlock(Gia_Man_t *, int)");
  }
  if (p->vCos->nSize % nBlock != 0) {
    __assert_fail("Gia_ManCoNum(p) % nBlock == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x6be,"Gia_Man_t *Gia_ManDupBlock(Gia_Man_t *, int)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar1);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar1);
  }
  p_00->pName = pcVar8;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar1);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar1);
  }
  p_00->pSpec = pcVar8;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  pVVar10 = p->vCis;
  if (0 < pVVar10->nSize) {
    uVar14 = 0;
    do {
      iVar6 = pVVar10->pArray[uVar14];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_001e2052;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar5 = 0;
      if ((int)((long)((ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 | uVar14 & 0xffffffff) %
               (long)nBlock) == 0) {
        pGVar9 = Gia_ManAppendObj(p_00);
        uVar3 = *(ulong *)pGVar9;
        *(ulong *)pGVar9 = uVar3 | 0x9fffffff;
        *(ulong *)pGVar9 =
             uVar3 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar4 = p_00->pObjs;
        if ((pGVar9 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar9)) {
LAB_001e2071:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555);
        pGVar4 = p_00->pObjs;
        if ((pGVar9 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar9)) goto LAB_001e2071;
        uVar5 = (int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * 0x55555556;
      }
      pGVar2[iVar6].Value = uVar5;
      uVar14 = uVar14 + 1;
      pVVar10 = p->vCis;
    } while ((long)uVar14 < (long)pVVar10->nSize);
  }
  Gia_ManHashAlloc(p_00);
  if (0 < p->nObjs) {
    lVar15 = 8;
    lVar12 = 0;
    do {
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar14 = *(ulong *)((long)pGVar2 + lVar15 + -8);
      if ((uVar14 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar14) {
        uVar5 = *(uint *)((long)pGVar2 +
                         lVar15 + (ulong)(uint)((int)(uVar14 & 0x1fffffff) << 2) * -3);
        if (((int)uVar5 < 0) ||
           (uVar13 = *(uint *)((long)pGVar2 +
                              lVar15 + (ulong)((uint)(uVar14 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar13 < 0)) goto LAB_001e2090;
        iVar6 = Gia_ManHashAnd(p_00,uVar5 ^ (uint)(uVar14 >> 0x1d) & 1,
                               uVar13 ^ (uint)(uVar14 >> 0x3d) & 1);
        *(int *)(&pGVar2->field_0x0 + lVar15) = iVar6;
      }
      lVar12 = lVar12 + 1;
      lVar15 = lVar15 + 0xc;
    } while (lVar12 < p->nObjs);
  }
  pVVar10 = p->vCos;
  if (0 < pVVar10->nSize) {
    uVar14 = 0;
    do {
      iVar6 = pVVar10->pArray[uVar14];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) {
LAB_001e2052:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if ((int)((long)((ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 | uVar14 & 0xffffffff) %
               (long)nBlock) == 0) {
        pGVar2 = p->pObjs + iVar6;
        uVar13 = (uint)*(undefined8 *)pGVar2;
        uVar5 = pGVar2[-(ulong)(uVar13 & 0x1fffffff)].Value;
        if ((int)uVar5 < 0) {
LAB_001e2090:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        Gia_ManAppendCo(p_00,uVar13 >> 0x1d & 1 ^ uVar5);
      }
      uVar14 = uVar14 + 1;
      pVVar10 = p->vCos;
    } while ((long)uVar14 < (long)pVVar10->nSize);
  }
  Gia_ManSetRegNum(p_00,p->nRegs / nBlock);
  pGVar11 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar11;
}

Assistant:

Gia_Man_t * Gia_ManDupBlock( Gia_Man_t * p, int nBlock )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj; int i;
    assert( Gia_ManCiNum(p) % nBlock == 0 );
    assert( Gia_ManCoNum(p) % nBlock == 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = (i % nBlock == 0) ? Gia_ManAppendCi(pNew) : 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        if ( i % nBlock == 0 )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p)/nBlock );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}